

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTraits.h
# Opt level: O2

string_view slang::typeName<std::__cxx11::string>(void)

{
  size_t __pos;
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  string_view name;
  
  name._M_len = 0x4f;
  name._M_str = "std::string_view slang::detail::wrappedTypeName() [T = std::basic_string<char>]";
  __pos = detail::wrappedTypeNamePrefixLength();
  sVar1 = detail::wrappedTypeNameSuffixLength();
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&name,__pos,0x4f - (sVar1 + __pos));
  sVar3._M_len = bVar2._M_len;
  sVar3._M_str = bVar2._M_str;
  return sVar3;
}

Assistant:

constexpr std::string_view typeName() {
    // https://stackoverflow.com/questions/81870/is-it-possible-to-print-a-variables-type-in-standard-c/64490578#64490578
    auto name = detail::wrappedTypeName<T>();
    auto prefixLength = detail::wrappedTypeNamePrefixLength();
    auto suffixLength = detail::wrappedTypeNameSuffixLength();
    return name.substr(prefixLength, name.length() - prefixLength - suffixLength);
}